

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void libcellml::updateUnitsMap(UnitsPtr *units,UnitsMap *unitsMap,double exp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  element_type *peVar4;
  pointer ppVar5;
  size_t sVar6;
  string *psVar7;
  UnitsPtr refUnits;
  undefined1 local_168 [8];
  ModelPtr model;
  double uExp;
  double expMult;
  string id;
  string pre;
  string ref;
  size_t i;
  undefined1 local_c0 [24];
  UnitsPtr importedUnits;
  ImportSourcePtr importSource;
  _Self local_60 [3];
  _Self local_48;
  iterator found;
  string unitsName;
  double exp_local;
  UnitsMap *unitsMap_local;
  UnitsPtr *units_local;
  
  unitsName.field_2._8_8_ = exp;
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)units);
  bVar3 = Units::isBaseUnit(peVar4);
  if (bVar3) {
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    NamedEntity::name_abi_cxx11_((string *)&found,&peVar4->super_NamedEntity);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::find(unitsMap,(string *)&found);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end(unitsMap);
    bVar3 = std::operator==(&local_48,local_60);
    uVar2 = unitsName.field_2._8_8_;
    if (bVar3) {
      std::
      map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::emplace<std::__cxx11::string&,double&>
                ((map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)unitsMap,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&found,
                 (double *)((long)&unitsName.field_2 + 8));
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
               ::operator->(&local_48);
      ppVar5->second = (double)uVar2 + ppVar5->second;
    }
    std::__cxx11::string::~string((string *)&found);
  }
  else {
    bVar3 = isStandardUnit(units);
    if (bVar3) {
      peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      p_Var1 = &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      NamedEntity::name_abi_cxx11_((string *)p_Var1,&peVar4->super_NamedEntity);
      updateUnitsMapWithStandardUnit((string *)p_Var1,unitsMap,(double)unitsName.field_2._8_8_);
      std::__cxx11::string::~string
                ((string *)
                 &importSource.
                  super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      bVar3 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
      if (bVar3) {
        std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)units);
        p_Var1 = &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        ImportedEntity::importSource((ImportedEntity *)p_Var1);
        std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)p_Var1);
        ImportSource::model((ImportSource *)local_c0);
        psVar7 = (string *)
                 std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c0);
        peVar4 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        ImportedEntity::importReference_abi_cxx11_((string *)&i,&peVar4->super_ImportedEntity);
        Model::units((Model *)(local_c0 + 0x10),psVar7);
        std::__cxx11::string::~string((string *)&i);
        std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_c0);
        updateUnitsMap((UnitsPtr *)(local_c0 + 0x10),unitsMap,1.0);
        std::shared_ptr<libcellml::Units>::~shared_ptr
                  ((shared_ptr<libcellml::Units> *)(local_c0 + 0x10));
        std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                  ((shared_ptr<libcellml::ImportSource> *)
                   &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        ref.field_2._8_8_ = 0;
        while( true ) {
          peVar4 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          sVar6 = Units::unitCount(peVar4);
          if (sVar6 <= (ulong)ref.field_2._8_8_) break;
          std::__cxx11::string::string((string *)(pre.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(id.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&expMult);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          Units::unitAttributes
                    (peVar4,ref.field_2._8_8_,(string *)(pre.field_2._M_local_buf + 8),
                     (string *)(id.field_2._M_local_buf + 8),
                     (double *)
                     &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&uExp,(string *)&expMult);
          bVar3 = isStandardUnitName((string *)((long)&pre.field_2 + 8));
          if (bVar3) {
            updateUnitsMapWithStandardUnit
                      ((string *)((long)&pre.field_2 + 8),unitsMap,
                       (double)model.
                               super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi * (double)unitsName.field_2._8_8_);
          }
          else {
            p_Var1 = &refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
                      ((shared_ptr<libcellml::ParentedEntity_const> *)p_Var1,units);
            owningModel((libcellml *)local_168,(ParentedEntityConstPtr *)p_Var1);
            std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
                      ((shared_ptr<const_libcellml::ParentedEntity> *)
                       &refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            psVar7 = (string *)
                     std::
                     __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_168);
            Model::units((Model *)&stack0xfffffffffffffe78,psVar7);
            updateUnitsMap((UnitsPtr *)&stack0xfffffffffffffe78,unitsMap,
                           (double)model.
                                   super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi * (double)unitsName.field_2._8_8_);
            std::shared_ptr<libcellml::Units>::~shared_ptr
                      ((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffe78);
            std::shared_ptr<libcellml::Model>::~shared_ptr
                      ((shared_ptr<libcellml::Model> *)local_168);
          }
          std::__cxx11::string::~string((string *)&expMult);
          std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(pre.field_2._M_local_buf + 8));
          ref.field_2._8_8_ = ref.field_2._8_8_ + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void updateUnitsMap(const UnitsPtr &units, UnitsMap &unitsMap, double exp = 1.0)
{
    if (units->isBaseUnit()) {
        auto unitsName = units->name();
        auto found = unitsMap.find(unitsName);
        if (found == unitsMap.end()) {
            unitsMap.emplace(unitsName, exp);
        } else {
            found->second += exp;
        }
    } else if (isStandardUnit(units)) {
        updateUnitsMapWithStandardUnit(units->name(), unitsMap, exp);
    } else if (units->isImport()) {
        auto importSource = units->importSource();
        auto importedUnits = importSource->model()->units(units->importReference());
        updateUnitsMap(importedUnits, unitsMap);
    } else {
        for (size_t i = 0; i < units->unitCount(); ++i) {
            std::string ref;
            std::string pre;
            std::string id;
            double expMult;
            double uExp;
            units->unitAttributes(i, ref, pre, uExp, expMult, id);
            if (isStandardUnitName(ref)) {
                updateUnitsMapWithStandardUnit(ref, unitsMap, uExp * exp);
            } else {
                auto model = owningModel(units);
                auto refUnits = model->units(ref);
                updateUnitsMap(refUnits, unitsMap, uExp * exp);
            }
        }
    }
}